

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrSignature *
cfd::core::SchnorrUtil::Sign
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          ByteData256 *aux_rand)

{
  ByteData local_40;
  ByteData256 *local_28;
  ByteData256 *aux_rand_local;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  local_28 = aux_rand;
  aux_rand_local = (ByteData256 *)sk;
  sk_local = (Privkey *)msg;
  msg_local = (ByteData256 *)__return_storage_ptr__;
  ByteData256::GetData(&local_40,aux_rand);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)0x0,&local_40);
  ByteData::~ByteData(&local_40);
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::Sign(
    const ByteData256 &msg, const Privkey &sk, const ByteData256 &aux_rand) {
  return SignCommon(msg, sk, nullptr, aux_rand.GetData());
}